

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O2

void __thiscall
GrcManager::WalkDirectivesTree
          (GrcManager *this,RefAST *ast,int *pnCollisionFix,int *pnAutoKern,
          int *pnCollisionThreshold,int *pnDir)

{
  GrcSymbolTable *this_00;
  pointer pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Symbol this_01;
  uint *puVar6;
  GrcManager *this_02;
  RefAST *this_03;
  string *staMsg;
  allocator local_33a;
  bool fM;
  RefAST *local_338;
  allocator local_329;
  undefined1 local_328 [40];
  RefAST astValue;
  RefAST astDirective;
  RefAST local_2e8;
  RefAST local_2e0;
  RefAST local_2d8;
  RefAST local_2d0;
  RefAST local_2c8;
  RefAST local_2c0;
  RefAST local_2b8;
  RefAST local_2b0;
  RefAST local_2a8;
  RefAST local_2a0;
  RefAST local_298;
  RefAST local_290;
  uint *local_288;
  uint *local_280;
  uint *local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string staName;
  
  local_338 = ast;
  local_288 = (uint *)pnCollisionThreshold;
  local_280 = (uint *)pnAutoKern;
  AST::getFirstChild(ast->ref->ptr);
  local_278 = (uint *)pnDir;
  do {
    if ((astDirective.ref == (Ref *)0x0) || ((astDirective.ref)->ptr == (AST *)0x0)) {
      RefCount<AST>::~RefCount(&astDirective);
      return;
    }
    AST::getFirstChild((astDirective.ref)->ptr);
    AST::getText_abi_cxx11_(&staName,*(AST **)local_328._0_8_);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_328);
    AST::getFirstChild((astDirective.ref)->ptr);
    AST::getNextSibling(*(AST **)local_328._0_8_);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_328);
    fM = false;
    this_02 = (GrcManager *)(astValue.ref)->ptr;
    iVar4 = AST::getType((AST *)this_02);
    if (iVar4 == 0x11) {
      if (astValue.ref != (Ref *)0x0) {
        (astValue.ref)->count = (astValue.ref)->count + 1;
      }
      local_290.ref = astValue.ref;
      uVar5 = NumericValue(this_02,&local_290,&fM);
      RefCount<AST>::~RefCount(&local_290);
    }
    else {
      iVar4 = AST::getType((astValue.ref)->ptr);
      uVar5 = 0;
      if (iVar4 != 0x51) {
        iVar4 = AST::getType((astValue.ref)->ptr);
        uVar5 = 1;
        if (iVar4 != 0x50) {
          std::__cxx11::string::string
                    ((string *)&local_70,"Invalid value for directive ",&local_33a);
          std::__cxx11::string::string((string *)&local_90,(string *)&staName);
          local_298.ref = local_338->ref;
          if (local_298.ref != (Ref *)0x0) {
            (local_298.ref)->count = (local_298.ref)->count + 1;
          }
          LineAndFile((GrpLineAndFile *)local_328,this,&local_298);
          GrcErrorList::AddError
                    (&g_errorList,0x4ab,(GdlObject *)0x0,&local_70,&local_90,
                     (GrpLineAndFile *)local_328);
          std::__cxx11::string::~string((string *)(local_328 + 8));
          RefCount<AST>::~RefCount(&local_298);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          uVar5 = 0xffffffff;
        }
      }
    }
    this_00 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_1b0,(string *)&staName);
    this_01 = GrcSymbolTable::FindSymbol(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((this_01 == (Symbol)0x0) ||
       (bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtDirective), bVar3 = fM, !bVar2)) {
      std::__cxx11::string::string((string *)&local_1d0,"Invalid directive: ",&local_33a);
      std::__cxx11::string::string((string *)&local_1f0,(string *)&staName);
      local_2a0.ref = local_338->ref;
      if (local_2a0.ref != (Ref *)0x0) {
        (local_2a0.ref)->count = (local_2a0.ref)->count + 1;
      }
      LineAndFile((GrpLineAndFile *)local_328,this,&local_2a0);
      staMsg = &local_1d0;
      GrcErrorList::AddError
                (&g_errorList,0x46d,(GdlObject *)0x0,staMsg,&local_1f0,(GrpLineAndFile *)local_328);
      std::__cxx11::string::~string((string *)(local_328 + 8));
      RefCount<AST>::~RefCount(&local_2a0);
      std::__cxx11::string::~string((string *)&local_1f0);
LAB_0019c189:
      std::__cxx11::string::~string((string *)staMsg);
    }
    else {
      if ((fM == true) && (this_01->m_expt != kexptMeas)) {
        std::__cxx11::string::string((string *)&local_210,"The ",&local_33a);
        std::__cxx11::string::string((string *)&local_230,(string *)&staName);
        std::__cxx11::string::string
                  ((string *)&local_250," directive does not expect a scaled value",&local_329);
        local_2a8.ref = local_338->ref;
        if (local_2a8.ref != (Ref *)0x0) {
          (local_2a8.ref)->count = (local_2a8.ref)->count + 1;
        }
        LineAndFile((GrpLineAndFile *)local_328,this,&local_2a8);
        GrcErrorList::AddError
                  (&g_errorList,0x46e,(GdlObject *)0x0,&local_210,&local_230,&local_250,
                   (GrpLineAndFile *)local_328);
        std::__cxx11::string::~string((string *)(local_328 + 8));
        RefCount<AST>::~RefCount(&local_2a8);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
      }
      bVar2 = std::operator==(&staName,"AttributeOverride");
      if (bVar2) {
        (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].m_fAttrOverride = uVar5 != 0;
      }
      else {
        bVar2 = std::operator==(&staName,"CodePage");
        if (bVar2) {
          (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].m_wCodePage = (utf16)uVar5;
        }
        else {
          bVar2 = std::operator==(&staName,"MaxRuleLoop");
          if (bVar2) {
            (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].m_nMaxRuleLoop = uVar5;
          }
          else {
            bVar2 = std::operator==(&staName,"MaxBackup");
            if (bVar2) {
              (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].m_nMaxBackup = uVar5;
            }
            else {
              bVar2 = std::operator==(&staName,"MUnits");
              if (bVar2) {
                (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].m_mUnits = uVar5;
              }
              else {
                bVar2 = std::operator==(&staName,"PointRadius");
                if (!bVar2) {
                  bVar3 = std::operator==(&staName,"CollisionFix");
                  if (bVar3) {
                    if (pnCollisionFix != (int *)0x0) {
                      iVar4 = AST::getType((astValue.ref)->ptr);
                      if (iVar4 == 0x50) {
                        *pnCollisionFix = 3;
                      }
                      else {
                        puVar6 = (uint *)pnCollisionFix;
                        if (uVar5 < 8) goto LAB_0019c797;
                        std::__cxx11::string::string
                                  ((string *)&local_d0,
                                   "The CollisionFix value must be between 0 and ",&local_33a);
                        std::__cxx11::to_string(&local_f0,7);
                        local_2c0.ref = local_338->ref;
                        if (local_2c0.ref != (Ref *)0x0) {
                          (local_2c0.ref)->count = (local_2c0.ref)->count + 1;
                        }
                        LineAndFile((GrpLineAndFile *)local_328,this,&local_2c0);
                        GrcErrorList::AddError
                                  (&g_errorList,0x4a2,(GdlObject *)0x0,&local_d0,&local_f0,
                                   (GrpLineAndFile *)local_328);
                        std::__cxx11::string::~string((string *)(local_328 + 8));
                        RefCount<AST>::~RefCount(&local_2c0);
                        std::__cxx11::string::~string((string *)&local_f0);
                        std::__cxx11::string::~string((string *)&local_d0);
                        *pnCollisionFix = 7;
                      }
                      goto LAB_0019c224;
                    }
                    staMsg = &local_b0;
                    std::__cxx11::string::string
                              ((string *)staMsg,
                               "The CollisionFix directive must be indicated directly on a pass",
                               &local_33a);
                    local_2b8.ref = local_338->ref;
                    if (local_2b8.ref != (Ref *)0x0) {
                      (local_2b8.ref)->count = (local_2b8.ref)->count + 1;
                    }
                    LineAndFile((GrpLineAndFile *)local_328,this,&local_2b8);
                    GrcErrorList::AddError
                              (&g_errorList,0x4a1,(GdlObject *)0x0,staMsg,
                               (GrpLineAndFile *)local_328);
                    std::__cxx11::string::~string((string *)(local_328 + 8));
                    this_03 = &local_2b8;
                  }
                  else {
                    bVar3 = std::operator==(&staName,"AutoKern");
                    if (bVar3) {
                      if (local_280 == (uint *)0x0) {
                        staMsg = &local_110;
                        std::__cxx11::string::string
                                  ((string *)staMsg,
                                   "The AutoKern directive must be indicated directly on a pass",
                                   &local_33a);
                        local_2c8.ref = local_338->ref;
                        if (local_2c8.ref != (Ref *)0x0) {
                          (local_2c8.ref)->count = (local_2c8.ref)->count + 1;
                        }
                        LineAndFile((GrpLineAndFile *)local_328,this,&local_2c8);
                        GrcErrorList::AddError
                                  (&g_errorList,0x4a5,(GdlObject *)0x0,staMsg,
                                   (GrpLineAndFile *)local_328);
                        std::__cxx11::string::~string((string *)(local_328 + 8));
                        this_03 = &local_2c8;
                      }
                      else {
                        puVar6 = local_280;
                        if (uVar5 < 3) goto LAB_0019c797;
                        staMsg = &local_130;
                        std::__cxx11::string::string
                                  ((string *)staMsg,
                                   "The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)"
                                   ,&local_33a);
                        local_2d0.ref = local_338->ref;
                        if (local_2d0.ref != (Ref *)0x0) {
                          (local_2d0.ref)->count = (local_2d0.ref)->count + 1;
                        }
                        LineAndFile((GrpLineAndFile *)local_328,this,&local_2d0);
                        GrcErrorList::AddWarning
                                  (&g_errorList,0x5ec,(GdlObject *)0x0,staMsg,
                                   (GrpLineAndFile *)local_328);
                        std::__cxx11::string::~string((string *)(local_328 + 8));
                        this_03 = &local_2d0;
                      }
                    }
                    else {
                      bVar3 = std::operator==(&staName,"CollisionThreshold");
                      if (bVar3) {
                        if (local_288 == (uint *)0x0) {
                          staMsg = &local_150;
                          std::__cxx11::string::string
                                    ((string *)staMsg,
                                     "The CollisionThreshold directive must be indicated directly on a pass"
                                     ,&local_33a);
                          local_2d8.ref = local_338->ref;
                          if (local_2d8.ref != (Ref *)0x0) {
                            (local_2d8.ref)->count = (local_2d8.ref)->count + 1;
                          }
                          LineAndFile((GrpLineAndFile *)local_328,this,&local_2d8);
                          GrcErrorList::AddError
                                    (&g_errorList,0x4a6,(GdlObject *)0x0,staMsg,
                                     (GrpLineAndFile *)local_328);
                          std::__cxx11::string::~string((string *)(local_328 + 8));
                          this_03 = &local_2d8;
                        }
                        else {
                          puVar6 = local_288;
                          if (0xffffff00 < uVar5 - 0x100) {
LAB_0019c797:
                            *puVar6 = uVar5;
                            goto LAB_0019c224;
                          }
                          staMsg = &local_170;
                          std::__cxx11::string::string
                                    ((string *)staMsg,
                                     "The CollisionThreshold value must be between 1 and 255",
                                     &local_33a);
                          local_2e0.ref = local_338->ref;
                          if (local_2e0.ref != (Ref *)0x0) {
                            (local_2e0.ref)->count = (local_2e0.ref)->count + 1;
                          }
                          LineAndFile((GrpLineAndFile *)local_328,this,&local_2e0);
                          GrcErrorList::AddError
                                    (&g_errorList,0x4a7,(GdlObject *)0x0,staMsg,
                                     (GrpLineAndFile *)local_328);
                          std::__cxx11::string::~string((string *)(local_328 + 8));
                          this_03 = &local_2e0;
                        }
                      }
                      else {
                        bVar3 = std::operator==(&staName,"Direction");
                        if (!bVar3) goto LAB_0019c224;
                        puVar6 = local_278;
                        if (local_278 != (uint *)0x0) goto LAB_0019c797;
                        staMsg = &local_190;
                        std::__cxx11::string::string
                                  ((string *)staMsg,
                                   "The Direction directive must be indicated directly on a pass",
                                   &local_33a);
                        local_2e8.ref = local_338->ref;
                        if (local_2e8.ref != (Ref *)0x0) {
                          (local_2e8.ref)->count = (local_2e8.ref)->count + 1;
                        }
                        LineAndFile((GrpLineAndFile *)local_328,this,&local_2e8);
                        GrcErrorList::AddError
                                  (&g_errorList,0x4aa,(GdlObject *)0x0,staMsg,
                                   (GrpLineAndFile *)local_328);
                        std::__cxx11::string::~string((string *)(local_328 + 8));
                        this_03 = &local_2e8;
                      }
                    }
                  }
                  RefCount<AST>::~RefCount(this_03);
                  goto LAB_0019c189;
                }
                if (bVar3 == false) {
                  std::__cxx11::string::string
                            ((string *)&local_270,
                             "The PointRadius directive requires a scaled value",&local_33a);
                  local_2b0.ref = local_338->ref;
                  if (local_2b0.ref != (Ref *)0x0) {
                    (local_2b0.ref)->count = (local_2b0.ref)->count + 1;
                  }
                  LineAndFile((GrpLineAndFile *)local_328,this,&local_2b0);
                  GrcErrorList::AddError
                            (&g_errorList,0x46f,(GdlObject *)0x0,&local_270,
                             (GrpLineAndFile *)local_328);
                  std::__cxx11::string::~string((string *)(local_328 + 8));
                  RefCount<AST>::~RefCount(&local_2b0);
                  std::__cxx11::string::~string((string *)&local_270);
                }
                pGVar1 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                pGVar1[-1].m_nPointRadius = uVar5;
                pGVar1[-1].m_mPrUnits = pGVar1[-1].m_mUnits;
              }
            }
          }
        }
      }
    }
LAB_0019c224:
    AST::getNextSibling((astDirective.ref)->ptr);
    RefCount<AST>::operator=(&astDirective,(RefCount<AST> *)local_328);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_328);
    RefCount<AST>::~RefCount(&astValue);
    std::__cxx11::string::~string((string *)&staName);
  } while( true );
}

Assistant:

void GrcManager::WalkDirectivesTree(RefAST ast, int * pnCollisionFix, int * pnAutoKern,
	int * pnCollisionThreshold, int * pnDir)
{
	Assert(ast->getType() == Zdirectives);

	RefAST astDirective = ast->getFirstChild();
	while (astDirective)
	{
		std::string staName = astDirective->getFirstChild()->getText();
		//	For now, all directives have numeric or boolean values.
		RefAST astValue = astDirective->getFirstChild()->getNextSibling();
		Assert(astValue);
		int nValue = -1;
		bool fM = false;
		if (astValue->getType() == LIT_INT)
			nValue = NumericValue(astValue, &fM);
		else if (astValue->getType() == LITERAL_false)
			nValue = 0;
		else if (astValue->getType() == LITERAL_true)
			nValue = 1;
		else
		{
			g_errorList.AddError(1195, NULL,
				"Invalid value for directive ", staName,
				LineAndFile(ast));
		}

		Symbol psym = SymbolTable()->FindSymbol(staName);
		if (!psym || !psym->FitsSymbolType(ksymtDirective))
			g_errorList.AddError(1133, NULL,
				"Invalid directive: ",
				staName,
				LineAndFile(ast));
		else
		{
			if (fM && psym->ExpType() != kexptMeas)
				g_errorList.AddError(1134, NULL,
					"The ",
					staName,
					" directive does not expect a scaled value",
					LineAndFile(ast));

			if (staName == "AttributeOverride")
				SetAttrOverride(nValue != 0);
			
			else if (staName == "CodePage")
				SetCodePage(nValue);

			else if (staName == "MaxRuleLoop")
				SetMaxRuleLoop(nValue);

			else if (staName == "MaxBackup")
				SetMaxBackup(nValue);

			else if (staName == "MUnits")
				SetMUnits(nValue);

			else if (staName == "PointRadius")
			{
				Assert(psym->ExpType() == kexptMeas);
				if (!fM)
					g_errorList.AddError(1135, NULL,
						"The PointRadius directive requires a scaled value",
						LineAndFile(ast));
				SetPointRadius(nValue, MUnits());
			}
			else if (staName == "CollisionFix")
			{
				if (pnCollisionFix == NULL)
					g_errorList.AddError(1185, NULL,
						"The CollisionFix directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
				{
					if (astValue->getType() == LITERAL_true)
						*pnCollisionFix = 3;	// default; should this be 1??
					else if (nValue > kMaxColIterations || nValue < 0)
					{
						g_errorList.AddError(1186, NULL,
							"The CollisionFix value must be between 0 and ",
							std::to_string(kMaxColIterations),
							LineAndFile(ast));
						*pnCollisionFix = kMaxColIterations;
					}
					else
						*pnCollisionFix = nValue;
				}
			}
			else if (staName == "AutoKern")
			{
				if (pnAutoKern == NULL)
					g_errorList.AddError(1189, NULL,
						"The AutoKern directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue != kakNone && nValue != kakFull && nValue != kakNoSpace)
					g_errorList.AddWarning(1516, NULL,
						"The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)",
						LineAndFile(ast));
				else
					*pnAutoKern = nValue;
			}
			else if (staName == "CollisionThreshold")
			{
				if (pnCollisionThreshold == NULL)
					g_errorList.AddError(1190, NULL,
						"The CollisionThreshold directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue < 1 || nValue > 255)
					g_errorList.AddError(1191, NULL,
						"The CollisionThreshold value must be between 1 and 255",
						LineAndFile(ast));
				else
					*pnCollisionThreshold = nValue;
			}
			else if (staName == "Direction")
			{
				if (pnDir == NULL)
					g_errorList.AddError(1194, NULL,
						"The Direction directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
					*pnDir = nValue;
			}
			else
			{
				Assert(false);
			}
		}

		astDirective = astDirective->getNextSibling();
	}
}